

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall testing::Matcher<long>::Matcher(Matcher<long> *this,long value)

{
  ComparisonBase<testing::internal::EqMatcher<long>,_long,_testing::internal::AnyEq> local_38;
  Matcher<long> local_30;
  long local_18;
  long value_local;
  Matcher<long> *this_local;
  
  local_18 = value;
  value_local = (long)this;
  internal::MatcherBase<long>::MatcherBase(&this->super_MatcherBase<long>);
  (this->super_MatcherBase<long>).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__Matcher_00257818;
  local_38.rhs_ = (long)Eq<long>(local_18);
  Matcher<testing::internal::EqMatcher<long>,void>(&local_30,(EqMatcher<long> *)&local_38);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }